

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::Sampler_testRemotelyControlledSampler_Test::TestBody
          (Sampler_testRemotelyControlledSampler_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  result_type_conflict rVar9;
  pointer *ppTVar10;
  ulong uVar11;
  AssertionResult gtest_ar_;
  undefined8 local_1f70;
  undefined1 local_1f68 [16];
  pointer local_1f58;
  long lStack_1f50;
  Metrics *local_1f48;
  Logger *local_1f40;
  string local_1f38;
  TraceID traceID;
  shared_ptr<jaegertracing::testutils::MockAgent> mockAgent;
  ProbabilisticSamplingStrategy probaStrategy;
  SamplingStrategyResponse config;
  RemotelyControlledSampler sampler;
  mt19937_64 rng;
  random_device device;
  
  testutils::MockAgent::make();
  jaegertracing::testutils::MockAgent::start();
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  _config = std::istream::_M_extract<long>;
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_strategyType
            ((type)&config);
  _probaStrategy = std::runtime_error::runtime_error;
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::__set_samplingRate(1.0);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::__set_probabilisticSampling
            ((ProbabilisticSamplingStrategy *)&config);
  testutils::MockAgent::
  addSamplingStrategy<char_const(&)[13],jaegertracing::sampling_manager::thrift::SamplingStrategyResponse&>
            (mockAgent.
             super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(char (*) [13])"test-service",&config);
  rng._M_x[0] = (unsigned_long)(rng._M_x + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&rng,"test-service","");
  memcpy((IPAddress *)&device,
         mockAgent.
         super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         + 0x240,0x88);
  net::IPAddress::authority_abi_cxx11_(&local_1f38,(IPAddress *)&device);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1f38,0,(char *)0x0,0x1dd8af);
  local_1f68._0_8_ = &local_1f58;
  ppTVar10 = (pointer *)(plVar5 + 2);
  if ((pointer *)*plVar5 == ppTVar10) {
    local_1f58 = *ppTVar10;
    lStack_1f50 = plVar5[3];
  }
  else {
    local_1f58 = *ppTVar10;
    local_1f68._0_8_ = (pointer *)*plVar5;
  }
  local_1f68._8_8_ = plVar5[1];
  *plVar5 = (long)ppTVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<jaegertracing::samplers::ProbabilisticSampler,std::allocator<jaegertracing::samplers::ProbabilisticSampler>,double_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_,
             (ProbabilisticSampler **)&gtest_ar_,
             (allocator<jaegertracing::samplers::ProbabilisticSampler> *)&local_1f70,
             (double *)&(anonymous_namespace)::kTestDefaultSamplingProbability);
  traceID._high = gtest_ar_._0_8_;
  traceID._low = (uint64_t)gtest_ar_.message_.ptr_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  local_1f70 = 100000000;
  jaegertracing::samplers::RemotelyControlledSampler::RemotelyControlledSampler
            (&sampler,(string *)&rng,(string *)local_1f68,(shared_ptr *)&traceID,10,
             (duration *)&local_1f70,local_1f40,local_1f48);
  if (traceID._low != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)traceID._low);
  }
  if (gtest_ar_.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_ar_.message_.ptr_);
  }
  if ((pointer *)local_1f68._0_8_ != &local_1f58) {
    operator_delete((void *)local_1f68._0_8_);
  }
  paVar1 = &local_1f38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f38._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f38._M_dataplus._M_p);
  }
  if ((unsigned_long *)rng._M_x[0] != rng._M_x + 2) {
    operator_delete((void *)rng._M_x[0]);
  }
  device.field_0.field_0._M_file = (void *)0x0;
  device.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x5f5e100;
  do {
    iVar3 = nanosleep((timespec *)&device,(timespec *)&device);
    if (iVar3 != -1) break;
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  std::random_device::random_device(&device);
  rng._M_x[0] = 0x1571;
  lVar7 = 1;
  uVar11 = 0x1571;
  do {
    uVar11 = (uVar11 >> 0x3e ^ uVar11) * 0x5851f42d4c957f2d + lVar7;
    rng._M_x[lVar7] = uVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x138);
  rng._M_p = 0x138;
  uVar4 = std::random_device::_M_getval();
  rng._M_x[0] = (unsigned_long)uVar4;
  lVar7 = 1;
  uVar11 = rng._M_x[0];
  do {
    uVar11 = (uVar11 >> 0x3e ^ uVar11) * 0x5851f42d4c957f2d + lVar7;
    rng._M_x[lVar7] = uVar11;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x138);
  rng._M_p = 0x138;
  lVar7 = std::chrono::_V2::steady_clock::now();
  lVar8 = std::chrono::_V2::steady_clock::now();
  if (lVar8 - lVar7 < 1000000000) {
    do {
      rVar9 = std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()(&rng);
      traceID._low = std::
                     mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                     ::operator()(&rng);
      local_1f38._M_dataplus._M_p = (pointer)paVar1;
      traceID._high = rVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f38,"op","");
      jaegertracing::samplers::RemotelyControlledSampler::isSampled
                ((TraceID *)local_1f68,(string *)&sampler);
      gtest_ar_.success_ = (bool)local_1f68[0];
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_1f68 + 8)
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f38._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f38._M_dataplus._M_p);
      }
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_1f38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_1f68,&gtest_ar_.success_,
                   "sampler.isSampled(traceID, kTestOperationName).isSampled()","false");
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1f70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x16d,(char *)local_1f68._0_8_);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_1f70,(Message *)&local_1f38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f70);
        if ((pointer *)local_1f68._0_8_ != &local_1f58) {
          operator_delete((void *)local_1f68._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f38._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          cVar2 = testing::internal::IsTrue(true);
          if ((cVar2 != '\0') &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f38._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0)) {
            (**(code **)(*(size_type *)local_1f38._M_dataplus._M_p + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        goto LAB_001bf681;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_1f68._0_8_ = (pointer *)0x0;
      local_1f68._8_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1312d00;
      do {
        iVar3 = nanosleep((timespec *)local_1f68,(timespec *)local_1f68);
        if (iVar3 != -1) break;
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      lVar8 = std::chrono::_V2::steady_clock::now();
    } while (lVar8 - lVar7 < 1000000000);
  }
  jaegertracing::samplers::RemotelyControlledSampler::close();
LAB_001bf681:
  std::random_device::_M_fini();
  RemotelyControlledSampler::~RemotelyControlledSampler(&sampler);
  jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::
  ~ProbabilisticSamplingStrategy(&probaStrategy);
  jaegertracing::sampling_manager::thrift::SamplingStrategyResponse::~SamplingStrategyResponse
            (&config);
  if (local_1f48 != (Metrics *)0x0) {
    jaegertracing::metrics::Metrics::~Metrics(local_1f48);
    operator_delete(local_1f48);
  }
  if (local_1f40 != (Logger *)0x0) {
    (*local_1f40->_vptr_Logger[1])();
  }
  if (mockAgent.super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mockAgent.
               super___shared_ptr<jaegertracing::testutils::MockAgent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(Sampler, testRemotelyControlledSampler)
{
    const auto mockAgent = testutils::MockAgent::make();
    mockAgent->start();
    const auto logger = logging::nullLogger();
    const auto metrics = metrics::Metrics::makeNullMetrics();
            
    // Make sure remote sampling probability is 1
    sampling_manager::thrift::SamplingStrategyResponse config;
    config.__set_strategyType(
        sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC);
    sampling_manager::thrift::ProbabilisticSamplingStrategy probaStrategy;
    probaStrategy.__set_samplingRate(1.0);
    config.__set_probabilisticSampling(probaStrategy);
    mockAgent->addSamplingStrategy("test-service", config);

    // Default probability of 0.5, switches to 1 when downloaded
    RemotelyControlledSampler sampler(
        "test-service",
        "http://" + mockAgent->samplingServerAddress().authority(),
        std::make_shared<ProbabilisticSampler>(kTestDefaultSamplingProbability),
        kTestDefaultMaxOperations,
        std::chrono::milliseconds(100),
        *logger,
        *metrics);
    
    // Wait a bit for remote config download to be done
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    std::random_device device;
    std::mt19937_64 rng;
    rng.seed(device());
    for (auto startTime = RemotelyControlledSampler::Clock::now();
         std::chrono::duration_cast<std::chrono::seconds>(
             RemotelyControlledSampler::Clock::now() - startTime)
             .count() < 1;) {
        TraceID traceID(rng(), rng());
        // If probability was 0.5 we could reasonnably assume one of 50 samples fail
        ASSERT_TRUE(sampler.isSampled(traceID, kTestOperationName).isSampled());
        std::this_thread::sleep_for(std::chrono::milliseconds(20));
    }
    sampler.close();
}